

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoTuplesRollingN.h
# Opt level: O1

void __thiscall
chrono::
ChConstraintTwoTuplesRollingN<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
::Project(ChConstraintTwoTuplesRollingN<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
          *this)

{
  float fVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  **ppCVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 extraout_var [56];
  
  if (((this->constraint_U !=
        (ChConstraintTwoTuplesRollingT<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
         *)0x0) &&
      (this->constraint_V !=
       (ChConstraintTwoTuplesRollingT<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        *)0x0)) &&
     (this->constraint_N !=
      (ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
       *)0x0)) {
    dVar14 = (this->constraint_N->
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
             ).super_ChConstraint.l_i;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar14;
    dVar9 = (this->
            super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
            ).super_ChConstraint.l_i;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar9;
    dVar2 = (this->constraint_U->
            super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
            ).super_ChConstraint.l_i;
    dVar10 = (this->constraint_V->
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
             ).super_ChConstraint.l_i;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar10;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar2 * dVar2;
    auVar11 = vfmadd231sd_fma(auVar11,auVar7,auVar7);
    if (auVar11._0_8_ < 0.0) {
      auVar12._0_8_ = sqrt(auVar11._0_8_);
      auVar12._8_56_ = extraout_var;
      auVar11 = auVar12._0_16_;
    }
    else {
      auVar11 = vsqrtsd_avx(auVar11,auVar11);
    }
    fVar1 = this->spinningfriction;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      auVar3._8_8_ = 0x7fffffffffffffff;
      auVar3._0_8_ = 0x7fffffffffffffff;
      auVar7 = vandpd_avx512vl(auVar8,auVar3);
      auVar16._0_8_ = (double)fVar1;
      auVar16._8_8_ = 0;
      dVar15 = auVar7._0_8_;
      if (dVar14 * auVar16._0_8_ <= dVar15) {
        auVar4._8_8_ = 0x7fffffffffffffff;
        auVar4._0_8_ = 0x7fffffffffffffff;
        auVar8 = vandpd_avx512vl(auVar19,auVar4);
        dVar17 = 0.0;
        if (auVar8._0_8_ < 1e-14) {
          dVar18 = 0.0;
        }
        else {
          dVar18 = 0.0;
          if (dVar14 * (-1.0 / auVar16._0_8_) <= dVar15) {
            auVar7 = vfmadd213sd_fma(auVar16,auVar7,auVar19);
            auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),ZEXT416(0x3f800000));
            dVar17 = auVar7._0_8_ / (double)auVar8._0_4_;
            dVar18 = dVar9 * ((dVar17 * auVar16._0_8_) / dVar15);
          }
        }
        (this->constraint_N->
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        ).super_ChConstraint.l_i = dVar17;
        (this->
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        ).super_ChConstraint.l_i = dVar18;
      }
    }
    fVar1 = this->rollingfriction;
    dVar9 = auVar11._0_8_;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      auVar13._0_8_ = (double)fVar1;
      auVar13._8_8_ = 0;
      if (dVar9 < dVar14 * auVar13._0_8_) {
        return;
      }
      ppCVar6 = (ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                 **)&this->constraint_V;
      auVar5._8_8_ = 0x7fffffffffffffff;
      auVar5._0_8_ = 0x7fffffffffffffff;
      auVar7 = vandpd_avx512vl(auVar19,auVar5);
      if ((auVar7._0_8_ < 1e-14) || (dVar9 < dVar14 * (-1.0 / auVar13._0_8_))) {
        (this->constraint_N->
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        ).super_ChConstraint.l_i = 0.0;
        (this->constraint_U->
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        ).super_ChConstraint.l_i = 0.0;
        dVar10 = 0.0;
      }
      else {
        auVar11 = vfmadd231sd_fma(auVar19,auVar11,auVar13);
        auVar19 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),ZEXT416(0x3f800000));
        dVar14 = auVar11._0_8_ / (double)auVar19._0_4_;
        dVar9 = (dVar14 * auVar13._0_8_) / dVar9;
        dVar10 = dVar10 * dVar9;
        (this->constraint_N->
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        ).super_ChConstraint.l_i = dVar14;
        (this->constraint_U->
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        ).super_ChConstraint.l_i = dVar2 * dVar9;
      }
    }
    else {
      (this->constraint_U->
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
      ).super_ChConstraint.l_i = 0.0;
      (this->constraint_V->
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
      ).super_ChConstraint.l_i = 0.0;
      dVar10 = 0.0;
      if (0.0 <= dVar14) {
        return;
      }
      ppCVar6 = &this->constraint_N;
    }
    ((*ppCVar6)->
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
    ).super_ChConstraint.l_i = dVar10;
  }
  return;
}

Assistant:

virtual void Project() override {
        if (!constraint_U)
            return;

        if (!constraint_V)
            return;

        if (!constraint_N)
            return;

        // METHOD
        // Anitescu-Tasora projection on rolling-friction cone generator and polar cone
        // (contractive, but performs correction on three components: normal,u,v)

        double f_n = constraint_N->Get_l_i();
        double t_n = this->Get_l_i();
        double t_u = constraint_U->Get_l_i();
        double t_v = constraint_V->Get_l_i();
        double t_tang = sqrt(t_v * t_v + t_u * t_u);
        double t_sptang = fabs(t_n);  // = sqrt(t_n*t_n);

        // A. Project the spinning friction (approximate - should do cone
        //   projection stuff as in B, but spinning friction is usually very low...)

        if (spinningfriction) {
            if (t_sptang < spinningfriction * f_n) {
                // inside upper cone? keep untouched!
            } else {
                // inside lower cone? reset  normal,u,v to zero!
                if ((t_sptang < -(1.0 / spinningfriction) * f_n) || (fabs(f_n) < 10e-15)) {
                    constraint_N->Set_l_i(0);
                    this->Set_l_i(0);
                } else {
                    // remaining case: project orthogonally to generator segment of upper cone (CAN BE simplified)
                    double f_n_proj = (t_sptang * spinningfriction + f_n) / (spinningfriction * spinningfriction + 1);
                    double t_tang_proj = f_n_proj * spinningfriction;
                    double tproj_div_t = t_tang_proj / t_sptang;
                    double t_n_proj = tproj_div_t * t_n;

                    constraint_N->Set_l_i(f_n_proj);
                    this->Set_l_i(t_n_proj);
                }
            }
        }

        // B. Project the rolling friction

        // shortcut
        if (!rollingfriction) {
            constraint_U->Set_l_i(0);
            constraint_V->Set_l_i(0);
            if (f_n < 0)
                constraint_N->Set_l_i(0);
            return;
        }

        // inside upper cone? keep untouched!
        if (t_tang < rollingfriction * f_n)
            return;

        // inside lower cone? reset  normal,u,v to zero!
        if ((t_tang < -(1.0 / rollingfriction) * f_n) || (fabs(f_n) < 10e-15)) {
            double f_n_proj = 0;
            double t_u_proj = 0;
            double t_v_proj = 0;

            constraint_N->Set_l_i(f_n_proj);
            constraint_U->Set_l_i(t_u_proj);
            constraint_V->Set_l_i(t_v_proj);

            return;
        }

        // remaining case: project orthogonally to generator segment of upper cone
        double f_n_proj = (t_tang * rollingfriction + f_n) / (rollingfriction * rollingfriction + 1);
        double t_tang_proj = f_n_proj * rollingfriction;
        double tproj_div_t = t_tang_proj / t_tang;
        double t_u_proj = tproj_div_t * t_u;
        double t_v_proj = tproj_div_t * t_v;

        constraint_N->Set_l_i(f_n_proj);
        constraint_U->Set_l_i(t_u_proj);
        constraint_V->Set_l_i(t_v_proj);
    }